

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cc
# Opt level: O0

void Minisat::printUsageAndExit(int param_1,char **argv,bool verbose)

{
  char *pcVar1;
  FILE *pFVar2;
  Size SVar3;
  char **ppcVar4;
  vec<Minisat::Option_*,_int> *pvVar5;
  Option **ppOVar6;
  byte in_DL;
  undefined8 *in_RSI;
  char *type;
  char *cat;
  int i;
  char *prev_type;
  char *prev_cat;
  char *usage;
  int local_3c;
  char *local_38;
  char *local_30;
  
  ppcVar4 = Option::getUsageString();
  if (*ppcVar4 != (char *)0x0) {
    fprintf(_stderr,*ppcVar4,*in_RSI);
  }
  pvVar5 = Option::getOptionList();
  sort<Minisat::Option*,Minisat::Option::OptionLt>(pvVar5);
  local_30 = (char *)0x0;
  local_38 = (char *)0x0;
  local_3c = 0;
  while( true ) {
    pvVar5 = Option::getOptionList();
    SVar3 = vec<Minisat::Option_*,_int>::size(pvVar5);
    if (SVar3 <= local_3c) break;
    pvVar5 = Option::getOptionList();
    ppOVar6 = vec<Minisat::Option_*,_int>::operator[](pvVar5,local_3c);
    pcVar1 = (*ppOVar6)->category;
    pvVar5 = Option::getOptionList();
    ppOVar6 = vec<Minisat::Option_*,_int>::operator[](pvVar5,local_3c);
    if (pcVar1 == local_30) {
      if ((*ppOVar6)->type_name != local_38) {
        fprintf(_stderr,"\n");
      }
    }
    else {
      fprintf(_stderr,"\n%s OPTIONS:\n\n",pcVar1);
    }
    pvVar5 = Option::getOptionList();
    ppOVar6 = vec<Minisat::Option_*,_int>::operator[](pvVar5,local_3c);
    (*(*ppOVar6)->_vptr_Option[3])(*ppOVar6,in_DL & 1);
    pvVar5 = Option::getOptionList();
    ppOVar6 = vec<Minisat::Option_*,_int>::operator[](pvVar5,local_3c);
    local_30 = (*ppOVar6)->category;
    pvVar5 = Option::getOptionList();
    ppOVar6 = vec<Minisat::Option_*,_int>::operator[](pvVar5,local_3c);
    local_38 = (*ppOVar6)->type_name;
    local_3c = local_3c + 1;
  }
  fprintf(_stderr,"\nHELP OPTIONS:\n\n");
  pFVar2 = _stderr;
  ppcVar4 = Option::getHelpPrefixString();
  fprintf(pFVar2,"  --%shelp        Print help message.\n",*ppcVar4);
  pFVar2 = _stderr;
  ppcVar4 = Option::getHelpPrefixString();
  fprintf(pFVar2,"  --%shelp-verb   Print verbose help message.\n",*ppcVar4);
  fprintf(_stderr,"\n");
  exit(0);
}

Assistant:

void Minisat::printUsageAndExit (int /*argc*/, char** argv, bool verbose)
{
    const char* usage = Option::getUsageString();
    if (usage != NULL)
        fprintf(stderr, usage, argv[0]);

    sort(Option::getOptionList(), Option::OptionLt());

    const char* prev_cat  = NULL;
    const char* prev_type = NULL;

    for (int i = 0; i < Option::getOptionList().size(); i++){
        const char* cat  = Option::getOptionList()[i]->category;
        const char* type = Option::getOptionList()[i]->type_name;

        if (cat != prev_cat)
            fprintf(stderr, "\n%s OPTIONS:\n\n", cat);
        else if (type != prev_type)
            fprintf(stderr, "\n");

        Option::getOptionList()[i]->help(verbose);

        prev_cat  = Option::getOptionList()[i]->category;
        prev_type = Option::getOptionList()[i]->type_name;
    }

    fprintf(stderr, "\nHELP OPTIONS:\n\n");
    fprintf(stderr, "  --%shelp        Print help message.\n", Option::getHelpPrefixString());
    fprintf(stderr, "  --%shelp-verb   Print verbose help message.\n", Option::getHelpPrefixString());
    fprintf(stderr, "\n");
    exit(0);
}